

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsBrokerGlobalError(HelicsBroker broker,int errorCode,char *errorString,HelicsError *err)

{
  Broker *pBVar1;
  long in_RDX;
  uint in_ESI;
  Broker *brk;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  __sv_type in_stack_ffffffffffffffc8;
  
  pBVar1 = getBroker((HelicsBroker)in_stack_ffffffffffffffc8._M_len,
                     (HelicsError *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (pBVar1 != (Broker *)0x0) {
    if (in_RDX == 0) {
      in_stack_ffffffffffffffc8 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_ffffffffffffffc8._M_str,(char *)in_stack_ffffffffffffffc8._M_len);
    }
    (*pBVar1->_vptr_Broker[0x1c])
              (pBVar1,(ulong)in_ESI,in_stack_ffffffffffffffc8._M_len,
               in_stack_ffffffffffffffc8._M_str);
  }
  return;
}

Assistant:

void helicsBrokerGlobalError(HelicsBroker broker, int errorCode, const char* errorString, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    brk->globalError(errorCode, AS_STRING_VIEW(errorString));
}